

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall ktx::PrintDiff::operator<<(PrintDiff *this,DiffBase<_khr_df_model_channels_e> *diff)

{
  bool bVar1;
  DiffBase<_khr_df_model_channels_e> *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  char *nl;
  char *space;
  size_t in_stack_fffffffffffffee8;
  DiffBase<_khr_df_model_channels_e> *in_stack_fffffffffffffef0;
  PrintDiff *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  int depth;
  PrintIndent *in_stack_ffffffffffffff40;
  PrintIndent *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  PrintIndent *in_stack_ffffffffffffff60;
  string local_90 [32];
  string local_70 [48];
  PrintIndent local_40 [2];
  char *local_20;
  char *local_18;
  DiffBase<_khr_df_model_channels_e> *local_10;
  
  local_10 = in_RSI;
  bVar1 = DiffBase<_khr_df_model_channels_e>::isDifferent(in_RSI);
  if (bVar1) {
    *(undefined1 *)&in_RDI[5]._M_str = 1;
    local_18 = "";
    if (*(int *)&in_RDI->_M_str != 2) {
      local_18 = " ";
    }
    local_20 = "";
    if (*(int *)&in_RDI->_M_str != 2) {
      local_20 = "\n";
    }
    if (*(int *)&in_RDI->_M_str == 0) {
      printContext(in_stack_ffffffffffffff10);
      bVar1 = DiffBase<_khr_df_model_channels_e>::hasValue
                        (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (bVar1) {
        in_stack_ffffffffffffff38 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &local_10->textHeader;
        in_stack_ffffffffffffff34 = 0;
        in_stack_ffffffffffffff40 = local_40;
        (**local_10->_vptr_DiffBase)();
        PrintIndent::operator()
                  (in_stack_ffffffffffffff50,(int)((ulong)in_RDI >> 0x20),
                   (char (*) [9])in_stack_ffffffffffffff40,
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        std::__cxx11::string::~string((string *)local_40);
      }
      bVar1 = DiffBase<_khr_df_model_channels_e>::hasValue
                        (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (bVar1) {
        (**local_10->_vptr_DiffBase)(local_70,local_10,1,(ulong)*(uint *)&in_RDI->_M_str);
        PrintIndent::operator()
                  (in_stack_ffffffffffffff50,(int)((ulong)in_RDI >> 0x20),
                   (char (*) [9])in_stack_ffffffffffffff40,
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        std::__cxx11::string::~string(local_70);
      }
    }
    else {
      beginJsonOutput(in_stack_ffffffffffffff10);
      PrintIndent::operator()
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                 (char (*) [11])in_stack_ffffffffffffff50,in_RDI,(char **)in_stack_ffffffffffffff40,
                 (char **)in_stack_ffffffffffffff38);
      bVar1 = DiffBase<_khr_df_model_channels_e>::hasValue
                        (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (bVar1) {
        (**local_10->_vptr_DiffBase)(local_90,local_10,0,(ulong)*(uint *)&in_RDI->_M_str);
        PrintIndent::operator()
                  (in_stack_ffffffffffffff50,(int)((ulong)in_RDI >> 0x20),
                   (char (*) [6])in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   (char **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        std::__cxx11::string::~string(local_90);
      }
      else {
        PrintIndent::operator()
                  (in_stack_ffffffffffffff50,(int)((ulong)in_RDI >> 0x20),
                   (char (*) [8])in_stack_ffffffffffffff40,(char **)in_stack_ffffffffffffff38);
      }
      bVar1 = DiffBase<_khr_df_model_channels_e>::hasValue
                        (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (bVar1) {
        (**local_10->_vptr_DiffBase)
                  (&stack0xffffffffffffff50,local_10,1,(ulong)*(uint *)&in_RDI->_M_str);
        PrintIndent::operator()
                  (in_stack_ffffffffffffff50,(int)((ulong)in_RDI >> 0x20),
                   (char (*) [5])in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   (char **)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        depth = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
      }
      else {
        PrintIndent::operator()
                  (in_stack_ffffffffffffff50,(int)((ulong)in_RDI >> 0x20),
                   (char (*) [7])in_stack_ffffffffffffff40,(char **)in_stack_ffffffffffffff38);
        depth = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      }
      PrintIndent::operator()
                (in_stack_ffffffffffffff40,depth,
                 (char (*) [2])CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    }
  }
  return;
}

Assistant:

void operator<<(const DiffBase<T>& diff) {
        if (!diff.isDifferent()) return;
        different = true;

        const auto space = outputFormat != OutputFormat::json_mini ?  " " : "";
        const auto nl = outputFormat != OutputFormat::json_mini ?  "\n" : "";

        if (outputFormat == OutputFormat::text) {
            printContext();
            if (diff.hasValue(0))
                printIndent(0, "-{}: {}\n", diff.textHeader, diff.value(0, outputFormat));
            if (diff.hasValue(1))
                printIndent(0, "+{}: {}\n", diff.textHeader, diff.value(1, outputFormat));
        } else {
            beginJsonOutput();
            printIndent(2, "\"{}\":{}[{}", diff.jsonPath, space, nl);
            if (diff.hasValue(0))
                printIndent(3, "{},{}", diff.value(0, outputFormat), nl);
            else
                printIndent(3, "null,{}", nl);
            if (diff.hasValue(1))
                printIndent(3, "{}{}", diff.value(1, outputFormat), nl);
            else
                printIndent(3, "null{}", nl);
            printIndent(2, "]");
        }
    }